

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_quick_exit.c
# Opt level: O2

int main(void)

{
  _func_void **pp_Var1;
  int iVar2;
  bool bVar3;
  
  if (_PDCLIB_quickexitptr == 0x28) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/at_quick_exit.c, line %d - %s\n"
           ,0x3e,"at_quick_exit( &checkhandler ) == 0");
  }
  else {
    pp_Var1 = _PDCLIB_quickexitstack + _PDCLIB_quickexitptr;
    _PDCLIB_quickexitptr = _PDCLIB_quickexitptr + 1;
    *pp_Var1 = checkhandler;
  }
  iVar2 = 0x20;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    if (_PDCLIB_quickexitptr == 0x28) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/at_quick_exit.c, line %d - %s\n"
             ,0x42,"at_quick_exit( &counthandler ) == 0");
    }
    else {
      pp_Var1 = _PDCLIB_quickexitstack + _PDCLIB_quickexitptr;
      _PDCLIB_quickexitptr = _PDCLIB_quickexitptr + 1;
      *pp_Var1 = counthandler;
    }
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || __STDC_VERSION__ >= 201112L
    int i;
    TESTCASE( at_quick_exit( &checkhandler ) == 0 );

    for ( i = 0; i < 32; ++i )
    {
        TESTCASE( at_quick_exit( &counthandler ) == 0 );
    }

#endif
    return TEST_RESULTS;
}